

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

void If_Dec7MoveTo(word *t,int v,int p,int *Pla2Var,int *Var2Pla)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  word wVar10;
  long lVar11;
  
  iVar1 = Var2Pla[v];
  if (iVar1 < p) {
    __assert_fail("Var2Pla[v] >= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x111,"void If_Dec7MoveTo(word *, int, int, int *, int *)");
  }
  while (iVar1 != p) {
    iVar3 = iVar1 + -1;
    if (iVar3 == 5) {
      uVar2 = *(uint *)((long)t + 4);
      *(int *)((long)t + 4) = (int)t[1];
      wVar10 = t[1] & 0xffffffff00000000 | (ulong)uVar2;
      lVar11 = 5;
    }
    else {
      if (5 < iVar1) {
        __assert_fail("v < 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                      ,0x10a,"void If_Dec7SwapAdjacent(word *, int)");
      }
      lVar11 = (long)iVar3;
      uVar4 = PMasks[lVar11][0];
      uVar5 = PMasks[lVar11][1];
      uVar6 = *t;
      uVar7 = t[1];
      bVar9 = (byte)(1 << ((byte)iVar3 & 0x1f));
      uVar8 = PMasks[lVar11][2];
      *t = (uVar6 & uVar8) >> (bVar9 & 0x3f) | (uVar5 & uVar6) << (bVar9 & 0x3f) | uVar4 & uVar6;
      wVar10 = (uVar7 & uVar8) >> (bVar9 & 0x3f) | (uVar5 & uVar7) << (bVar9 & 0x3f) | uVar4 & uVar7
      ;
    }
    t[1] = wVar10;
    Var2Pla[Pla2Var[lVar11]] = Var2Pla[Pla2Var[lVar11]] + 1;
    Var2Pla[Pla2Var[iVar1]] = Var2Pla[Pla2Var[iVar1]] + -1;
    iVar3 = Pla2Var[iVar1];
    Pla2Var[iVar1] = Pla2Var[lVar11];
    Pla2Var[lVar11] = iVar3;
    iVar1 = Var2Pla[v];
  }
  if (Pla2Var[(uint)p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x11d,"void If_Dec7MoveTo(word *, int, int, int *, int *)");
  }
  return;
}

Assistant:

static inline void If_Dec7MoveTo( word t[2], int v, int p, int Pla2Var[7], int Var2Pla[7] )
{
    int iPlace0, iPlace1;
    assert( Var2Pla[v] >= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        If_Dec7SwapAdjacent( t, iPlace0 );
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
    }
    assert( Pla2Var[p] == v );
}